

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControl::ensureCursorVisible(QWidgetTextControl *this)

{
  QWidgetTextControlPrivate *this_00;
  int position;
  long in_FS_OFFSET;
  QRectF local_68;
  QRectF local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  position = QTextCursor::position();
  QWidgetTextControlPrivate::rectForPosition(&local_68,this_00,position);
  local_48.xp = local_68.xp + -5.0;
  local_48.yp = local_68.yp + 0.0;
  local_48.w = local_68.w + 5.0 + 5.0;
  local_48.h = local_68.h + 0.0;
  visibilityRequest(this,&local_48);
  microFocusChanged(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::ensureCursorVisible()
{
    Q_D(QWidgetTextControl);
    QRectF crect = d->rectForPosition(d->cursor.position()).adjusted(-5, 0, 5, 0);
    emit visibilityRequest(crect);
    emit microFocusChanged();
}